

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

void __thiscall libDAI::TRW::TRW(TRW *this,FactorGraph *fg,Properties *opts)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  Exception *this_00;
  ulong uVar7;
  long lVar8;
  undefined1 in_XMM2 [16];
  allocator_type local_69;
  vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *local_68;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *local_60;
  string local_58;
  double local_38;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e8850;
  local_68 = (vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)&this->_messages
  ;
  p_Var1 = &(this->_rho_e).
            super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).outertol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).maxouteriter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this->_rho_e).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl = 0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->_rho_e_descent).
            super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_rho_e).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &(this->_rho_e_descent).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->_rho_e_descent).
    super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_rho_e_descent).
  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar4 = initProps(this);
  if (bVar4) {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::_M_erase_at_end
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)local_68,
               (this->_messages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)local_68,
               *(long *)(CONCAT44(extraout_var,iVar5) + 0x48) -
               *(long *)(CONCAT44(extraout_var,iVar5) + 0x40) >> 4);
    lVar8 = 0;
    uVar7 = 0;
    local_60 = &this->_newmessages;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x40) >> 4) <= uVar7) break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar2 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x40) + lVar8);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x30))
                        ((long *)CONCAT44(extraout_var_02,iVar5),uVar2);
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,*(size_type *)(lVar6 + 8));
      local_38 = 1.0 / auVar3._0_8_;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_58,*(size_type *)(lVar6 + 8),
                 &local_38,&local_69);
      std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
      emplace_back<libDAI::TProb<double>>(local_68,(TProb<double> *)&local_58);
      if (local_58._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_58._M_dataplus._M_p,
                        local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    }
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
              (local_60,(vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                        local_68);
    init_rho_e(this);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"trw.cpp, line 74","");
  Exception::Exception(this_00,8,&local_58);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TRW::TRW(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _messages(), _newmessages(), _rho_e(), _rho_e_descent() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // create messages
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            _messages.push_back( Prob( grm().var(i).states() ) );
        }

        // create new_messages
        _newmessages = _messages;

        // create valid initial rho_e
        init_rho_e();
    }